

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::openChannels(QProcessPrivate *this)

{
  char *in_RDI;
  long in_FS_OFFSET;
  Channel *in_stack_00000008;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *pcVar1;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar2;
  QMessageLogger local_68;
  QMessageLogger local_48;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = in_RDI;
  if (in_RDI[0x2a8] == '\x01') {
    if (in_RDI[0x1b8] != '\0') {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_RDI,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QMessageLogger::warning
                (&local_28,"QProcess::openChannels: Inconsistent stdin channel configuration");
    }
  }
  else {
    bVar2 = openChannel(this,in_stack_00000008);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0078fc45;
    }
  }
  if ((in_RDI[0x2a7] == '\x02') || (in_RDI[0x2a7] == '\x03')) {
    if (in_RDI[0x1f0] != '\0') {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 pcVar1,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QMessageLogger::warning
                (&local_48,"QProcess::openChannels: Inconsistent stdout channel configuration");
    }
  }
  else {
    bVar2 = openChannel(this,in_stack_00000008);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0078fc45;
    }
  }
  if (((in_RDI[0x2a7] == '\x02') || (in_RDI[0x2a7] == '\x04')) || (in_RDI[0x2a7] == '\x01')) {
    if (in_RDI[0x228] != '\0') {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 pcVar1,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QMessageLogger::warning
                (&local_68,"QProcess::openChannels: Inconsistent stderr channel configuration");
    }
  }
  else {
    bVar2 = openChannel(this,in_stack_00000008);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0078fc45;
    }
  }
  bVar2 = true;
LAB_0078fc45:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QProcessPrivate::openChannels()
{
    // stdin channel.
    if (inputChannelMode == QProcess::ForwardedInputChannel) {
        if (stdinChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdin channel configuration");
    } else if (!openChannel(stdinChannel)) {
        return false;
    }

    // stdout channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedOutputChannel) {
        if (stdoutChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stdout channel configuration");
    } else if (!openChannel(stdoutChannel)) {
        return false;
    }

    // stderr channel.
    if (processChannelMode == QProcess::ForwardedChannels
            || processChannelMode == QProcess::ForwardedErrorChannel
            || processChannelMode == QProcess::MergedChannels) {
        if (stderrChannel.type != Channel::Normal)
            qWarning("QProcess::openChannels: Inconsistent stderr channel configuration");
    } else if (!openChannel(stderrChannel)) {
        return false;
    }

    return true;
}